

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmanager_tests.cpp
# Opt level: O0

void __thiscall
blockmanager_tests::blockmanager_scan_unlink_already_pruned_files::test_method
          (blockmanager_scan_unlink_already_pruned_files *this)

{
  bool bVar1;
  CBlockIndex *pCVar2;
  pointer pCVar3;
  long in_FS_OFFSET;
  int new_file_number;
  int file_number;
  BlockManager *blockman;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *chainman;
  FlatFilePos new_pos;
  CBlockIndex *new_tip;
  FlatFilePos pos;
  CBlockIndex *old_tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  char *in_stack_fffffffffffffaf8;
  CBlockIndex *in_stack_fffffffffffffb00;
  assertion_result *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  lazy_ostream *in_stack_fffffffffffffb20;
  anon_class_16_2_f7b292ae *in_stack_fffffffffffffb28;
  size_t line_num;
  const_string *in_stack_fffffffffffffb30;
  const_string *file;
  Chainstate *in_stack_fffffffffffffb38;
  unit_test_log_t *this_00;
  FlatFilePos *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  TestChain100Setup *in_stack_fffffffffffffb50;
  BlockManager *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffbec;
  CBlockIndex *pCVar4;
  lazy_ostream local_3c0 [2];
  assertion_result local_3a0;
  unit_test_log_t local_388 [3];
  undefined1 local_350 [16];
  undefined1 local_340 [64];
  CBlockIndex *local_300;
  undefined1 local_2f8 [56];
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [2];
  CBlockIndex *local_268;
  CBlockIndex *local_260;
  const_string local_258 [2];
  lazy_ostream local_238 [2];
  assertion_result local_218 [2];
  CBlockIndex *local_1e0;
  CBlockIndex *local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  CBlockIndex *local_1a8;
  CBlockIndex *local_1a0;
  CBlockIndex **local_198;
  CBlockIndex *local_190;
  CBlockIndex *local_188;
  FlatFilePos local_180 [47];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (CBlockIndex *)
           inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                      (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                      (char *)in_stack_fffffffffffffb20,
                      (char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  pCVar3 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffffaf8);
  pCVar4 = (CBlockIndex *)&pCVar3->m_blockman;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  local_190 = pCVar2;
  local_188 = test_method::anon_class_8_1_3d09f077::operator()
                        ((anon_class_8_1_3d09f077 *)in_stack_fffffffffffffb28);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  local_198 = &local_188;
  local_1a8 = pCVar2;
  local_1a0 = pCVar4;
  test_method::anon_class_24_3_388a5d96::operator()
            ((anon_class_24_3_388a5d96 *)in_stack_fffffffffffffb38);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffaf8);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffffb20);
  GetScriptForRawPubKey((CPubKey *)in_stack_fffffffffffffb40);
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_fffffffffffffb50,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
             (CScript *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffffaf8);
  CScript::~CScript((CScript *)in_stack_fffffffffffffaf8);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb08);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffb38,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb30,
             (char *)in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb1c,SUB41((uint)in_stack_fffffffffffffb18 >> 0x18,0));
  CBlockIndex::GetBlockPos(in_stack_fffffffffffffb00);
  ::node::BlockManager::PruneOneBlockFile(in_stack_fffffffffffffb78,in_stack_fffffffffffffbec);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffaf8);
  FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffffaf8,0,0x4892c4);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  local_1e0 = pCVar2;
  local_1d8 = pCVar4;
  test_method::anon_class_16_2_c6cf466d::operator()
            ((anon_class_16_2_c6cf466d *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
               (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
    ::node::BlockManager::OpenBlockFile
              ((BlockManager *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
               in_stack_fffffffffffffb40,SUB81((ulong)in_stack_fffffffffffffb38 >> 0x38,0));
    AutoFile::IsNull((AutoFile *)in_stack_fffffffffffffaf8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffb08,SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,
               (basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffaf8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_218,local_238,local_258,0x4e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffaf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffaf8);
    AutoFile::~AutoFile((AutoFile *)in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  *(undefined1 *)&pCVar4[3].nTimeMax = 1;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  local_268 = pCVar2;
  local_260 = pCVar4;
  test_method::anon_class_16_2_c6cf466d::operator()
            ((anon_class_16_2_c6cf466d *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
               (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
    ::node::BlockManager::OpenBlockFile
              ((BlockManager *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
               in_stack_fffffffffffffb40,SUB81((ulong)in_stack_fffffffffffffb38 >> 0x38,0));
    AutoFile::IsNull((AutoFile *)in_stack_fffffffffffffaf8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffb08,SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,
               (basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffaf8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a0,local_2c0,(const_string *)(local_2f8 + 0x18),0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffaf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffaf8);
    AutoFile::~AutoFile((AutoFile *)in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  local_2f8._8_8_ = pCVar2;
  local_2f8._16_8_ = pCVar4;
  test_method::anon_class_16_2_c6cf466d::operator()
            ((anon_class_16_2_c6cf466d *)
             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  local_300 = pCVar2;
  local_2f8._0_8_ =
       test_method::anon_class_8_1_3d09f077::operator()
                 ((anon_class_8_1_3d09f077 *)in_stack_fffffffffffffb28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
               (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb08 = (assertion_result *)0x1cf1618;
    in_stack_fffffffffffffb00 = (CBlockIndex *)local_2f8;
    in_stack_fffffffffffffaf8 = "old_tip";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,CBlockIndex_const*,CBlockIndex_const*>
              (local_340,local_350,0x5b,1,3,&local_188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffaf8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffffaf8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaf8);
  test_method::anon_class_16_2_f7b292ae::operator()(in_stack_fffffffffffffb28);
  FlatFilePos::FlatFilePos((FlatFilePos *)in_stack_fffffffffffffaf8,0,0x489887);
  do {
    file = (const_string *)(local_388 + 2);
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    this_00 = local_388;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,line_num,(const_string *)in_stack_fffffffffffffb20);
    ::node::BlockManager::OpenBlockFile
              ((BlockManager *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
               local_180,SUB81((ulong)this_00 >> 0x38,0));
    in_stack_fffffffffffffb4f = AutoFile::IsNull((AutoFile *)in_stack_fffffffffffffaf8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffb08,SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
    in_stack_fffffffffffffb20 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb00,
               (basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffaf8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_3a0,local_3c0,(const_string *)&stack0xfffffffffffffc20,0x5e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffaf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffaf8);
    AutoFile::~AutoFile((AutoFile *)in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockmanager_scan_unlink_already_pruned_files, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    const auto& chainman = Assert(m_node.chainman);
    auto& blockman = chainman->m_blockman;
    const CBlockIndex* old_tip{WITH_LOCK(chainman->GetMutex(), return chainman->ActiveChain().Tip())};
    WITH_LOCK(chainman->GetMutex(), blockman.GetBlockFileInfo(old_tip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));

    // Prune the older block file, but don't unlink it
    int file_number;
    {
        LOCK(chainman->GetMutex());
        file_number = old_tip->GetBlockPos().nFile;
        blockman.PruneOneBlockFile(file_number);
    }

    const FlatFilePos pos(file_number, 0);

    // Check that the file is not unlinked after ScanAndUnlinkAlreadyPrunedFiles
    // if m_have_pruned is not yet set
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());
    BOOST_CHECK(!blockman.OpenBlockFile(pos, true).IsNull());

    // Check that the file is unlinked after ScanAndUnlinkAlreadyPrunedFiles
    // once m_have_pruned is set
    blockman.m_have_pruned = true;
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());
    BOOST_CHECK(blockman.OpenBlockFile(pos, true).IsNull());

    // Check that calling with already pruned files doesn't cause an error
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());

    // Check that the new tip file has not been removed
    const CBlockIndex* new_tip{WITH_LOCK(chainman->GetMutex(), return chainman->ActiveChain().Tip())};
    BOOST_CHECK_NE(old_tip, new_tip);
    const int new_file_number{WITH_LOCK(chainman->GetMutex(), return new_tip->GetBlockPos().nFile)};
    const FlatFilePos new_pos(new_file_number, 0);
    BOOST_CHECK(!blockman.OpenBlockFile(new_pos, true).IsNull());
}